

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::ordered_dict<tinyusdz::CollectionInstance>::ordered_dict
          (ordered_dict<tinyusdz::CollectionInstance> *this,
          ordered_dict<tinyusdz::CollectionInstance> *param_1)

{
  ordered_dict<tinyusdz::CollectionInstance> *param_1_local;
  ordered_dict<tinyusdz::CollectionInstance> *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_keys,&param_1->_keys);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>_>
  ::map(&this->_m,&param_1->_m);
  return;
}

Assistant:

bool at(const size_t idx, T *dst) const {
    if (idx >= _keys.size()) {
      return false;
    }

    if (!_m.count(_keys[idx])) {
      // This should not happen though.
      return false;
    }

    (*dst) = _m.at(_keys[idx]);

    return true;
  }